

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O3

int green_future_acquire(green_future_t future)

{
  undefined8 *puVar1;
  
  if (future == (green_future_t)0x0) {
    return 1;
  }
  if (0 < future->refs) {
    future->refs = future->refs + 1;
    return 0;
  }
  green_future_acquire_cold_1();
  if (future != (green_future_t)0x0) {
    puVar1 = (undefined8 *)green_malloc(0x38);
    *puVar1 = future;
    *(undefined4 *)(puVar1 + 4) = 0;
    *(undefined4 *)(puVar1 + 1) = 1;
    *(undefined4 *)(puVar1 + 6) = 0xffffffff;
    return (int)puVar1;
  }
  return 0;
}

Assistant:

int green_future_acquire(green_future_t future)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future != NULL);
    green_assert(future->refs > 0);
    ++future->refs;
    return GREEN_SUCCESS;
}